

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::context_ended(info *this,string *desc)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 local_48 [8];
  context_info context;
  string *desc_local;
  info *this_local;
  
  context._40_8_ = desc;
  progress_base::context_ended((progress_base *)this,desc);
  sVar3 = std::
          stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
          ::size(&this->context_stack_);
  if (sVar3 != 1) {
    pvVar4 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top(&this->context_stack_);
    iVar1 = pvVar4->total;
    pvVar4 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top(&this->context_stack_);
    if (iVar1 <= pvVar4->skipped) goto LAB_00113521;
  }
  output_context_end_message(this);
LAB_00113521:
  pvVar4 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  context_info::context_info((context_info *)local_48,pvVar4);
  std::
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  ::pop(&this->context_stack_);
  bVar2 = std::
          stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
          ::empty(&this->context_stack_);
  if (!bVar2) {
    pvVar4 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top(&this->context_stack_);
    context_info::merge(pvVar4,(context_info *)local_48);
  }
  if (0 < this->not_yet_shown_) {
    this->not_yet_shown_ = this->not_yet_shown_ + -1;
  }
  context_info::~context_info((context_info *)local_48);
  return;
}

Assistant:

void context_ended(const std::string& desc) override {
        progress_base::context_ended(desc);
        if (context_stack_.size() == 1 || context_stack_.top().total > context_stack_.top().skipped) {
          output_context_end_message();
        }
        const context_info context = context_stack_.top(); // copy
        context_stack_.pop();
        if (!context_stack_.empty()) {
          context_stack_.top().merge(context);
        }
        if (not_yet_shown_ > 0) {
          --not_yet_shown_;
        }
      }